

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_synth.cpp
# Opt level: O0

VkPipeline
synthesize_graphics_pipeline
          (StateRecorder *recorder,vector<unsigned_char,_std::allocator<unsigned_char>_> *modules,
          spvc_compiler *compilers,VkPipelineLayout layout,VkRenderPass render_pass,
          uint8_t active_rt_mask,SpecConstant *specs)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  uint local_43c;
  undefined1 local_438 [4];
  uint32_t i_2;
  VkPipelineRasterizationStateCreateInfo ras;
  VkPipelineInputAssemblyStateCreateInfo ia;
  VkPipelineVertexInputStateCreateInfo vi;
  uint32_t uStack_3a0;
  VkVertexInputBindingDescription vertex_binding;
  vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  attributes;
  undefined1 local_378 [4];
  uint i_1;
  VkPipelineColorBlendAttachmentState attachments [8];
  undefined1 local_270 [8];
  VkPipelineColorBlendStateCreateInfo blend;
  VkPipelineDynamicStateCreateInfo dyn;
  VkPipelineTessellationStateCreateInfo tess;
  undefined1 local_1f8 [4];
  VkSampleMask sample_mask;
  VkPipelineMultisampleStateCreateInfo ms;
  VkPipelineViewportStateCreateInfo vp;
  VkViewport viewport;
  VkRect2D sci;
  VkGraphicsPipelineCreateInfo info;
  VkPipelineShaderStageCreateInfo stage;
  undefined1 local_a8 [8];
  VkShaderModuleCreateInfo module_info;
  undefined4 local_78;
  uint i;
  VkSpecializationInfo spec_info;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_> stages;
  uint8_t active_rt_mask_local;
  VkRenderPass render_pass_local;
  VkPipelineLayout layout_local;
  spvc_compiler *compilers_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *modules_local;
  StateRecorder *recorder_local;
  
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  vector((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          *)&spec_info.pData);
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  reserve((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           *)&spec_info.pData,7);
  memset(&local_78,0,0x20);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&specs->data);
  spec_info.pMapEntries = (VkSpecializationMapEntry *)(sVar3 << 2);
  spec_info.dataSize =
       (size_t)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(&specs->data);
  sVar3 = std::vector<VkSpecializationMapEntry,_std::allocator<VkSpecializationMapEntry>_>::size
                    (&specs->map_entries);
  local_78 = (undefined4)sVar3;
  spec_info._0_8_ =
       std::vector<VkSpecializationMapEntry,_std::allocator<VkSpecializationMapEntry>_>::data
                 (&specs->map_entries);
  for (module_info.pCode._4_4_ = 0; module_info.pCode._4_4_ < 7;
      module_info.pCode._4_4_ = module_info.pCode._4_4_ + 1) {
    bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      (modules + module_info.pCode._4_4_);
    if (!bVar2) {
      memset(local_a8,0,0x28);
      local_a8._0_4_ = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
      module_info._16_8_ =
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     (modules + module_info.pCode._4_4_);
      module_info.codeSize =
           (size_t)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             (modules + module_info.pCode._4_4_);
      bVar2 = Fossilize::StateRecorder::record_shader_module
                        (recorder,(VkShaderModule)(ulong)(module_info.pCode._4_4_ + 1),
                         (VkShaderModuleCreateInfo *)local_a8,0);
      if (!bVar2) {
        recorder_local = (StateRecorder *)0x0;
        goto LAB_00110943;
      }
      memset(&info.basePipelineIndex,0,0x30);
      info.basePipelineIndex = 0x12;
      std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
      ::push_back((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                   *)&spec_info.pData,(value_type *)&info.basePipelineIndex);
    }
  }
  memset(&sci.extent,0,0x90);
  sci.extent.width = 0x1c;
  viewport.minDepth = 0.0;
  viewport.maxDepth = 0.0;
  sci.offset.x = 0x400;
  sci.offset.y = 0x400;
  vp.pScissors = (VkRect2D *)0x0;
  viewport.x = 1024.0;
  viewport.y = 1024.0;
  viewport.width = 0.0;
  viewport.height = 1.0;
  memset(&ms.alphaToCoverageEnable,0,0x30);
  ms.alphaToCoverageEnable = 0x16;
  vp.pViewports._0_4_ = 1;
  vp.pNext._4_4_ = 1;
  vp._32_8_ = &viewport.minDepth;
  vp._16_8_ = &vp.pScissors;
  info.pTessellationState = (VkPipelineTessellationStateCreateInfo *)&ms.alphaToCoverageEnable;
  memset(local_1f8,0,0x30);
  local_1f8 = (undefined1  [4])0x18;
  tess.patchControlPoints = 0xffffffff;
  ms._24_8_ = &tess.patchControlPoints;
  ms.pNext._4_4_ = 1;
  info.pRasterizationState = (VkPipelineRasterizationStateCreateInfo *)local_1f8;
  dyn.pDynamicStates = (VkDynamicState *)0x15;
  tess.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  tess._4_4_ = 0;
  tess.pNext = (void *)0x100000000;
  info.pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)&dyn.pDynamicStates;
  blend.blendConstants[2] = 3.78351e-44;
  blend.blendConstants[3] = 0.0;
  dyn.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  dyn._4_4_ = 0;
  dyn.pNext = (void *)0x0;
  dyn.flags = 0;
  dyn.dynamicStateCount = 0;
  info.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)(blend.blendConstants + 2);
  memset(local_270,0,0x38);
  local_270._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  memset(local_378,0,0x100);
  for (attributes.
       super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      attributes.
      super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 8;
      attributes.
      super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           attributes.
           super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    if (((uint)active_rt_mask &
        1 << ((byte)attributes.
                    super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ & 0x1f)) != 0) {
      blend.logicOpEnable =
           attributes.
           super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      attachments
      [attributes.
       super__Vector_base<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_].dstAlphaBlendFactor =
           VK_BLEND_FACTOR_SRC1_COLOR;
    }
  }
  blend._24_8_ = local_378;
  info.pDepthStencilState = (VkPipelineDepthStencilStateCreateInfo *)local_270;
  std::vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ::vector((vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
            *)&vertex_binding.stride);
  memset((void *)((long)&vi.pVertexAttributeDescriptions + 4),0,0xc);
  memset(&ia.primitiveRestartEnable,0,0x30);
  ia.primitiveRestartEnable = 0x13;
  if (*compilers != (spvc_compiler)0x0) {
    bVar2 = append_attributes(*compilers,
                              (vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                               *)&vertex_binding.stride,&uStack_3a0);
    if (!bVar2) {
      recorder_local = (StateRecorder *)0x0;
      goto LAB_00110937;
    }
    vi.pNext._4_4_ = 1;
    vi._16_8_ = (long)&vi.pVertexAttributeDescriptions + 4;
    sVar3 = std::
            vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
            ::size((vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                    *)&vertex_binding.stride);
    vi.pVertexBindingDescriptions._0_4_ = (undefined4)sVar3;
    vi._32_8_ = std::
                vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                ::data((vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
                        *)&vertex_binding.stride);
    info.pStages = (VkPipelineShaderStageCreateInfo *)&ia.primitiveRestartEnable;
  }
  ras.lineWidth = 2.8026e-44;
  ras._60_4_ = 0;
  ia.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  ia._4_4_ = 0;
  ia.pNext = (void *)0x0;
  ia.flags = 0;
  ia.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  if (*compilers != (spvc_compiler)0x0) {
    ia.pNext = (void *)0x300000000;
    info.pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)&ras.lineWidth;
  }
  memset(local_438,0,0x40);
  local_438 = (undefined1  [4])0x17;
  ras.rasterizerDiscardEnable = 0;
  ras.polygonMode = VK_POLYGON_MODE_FILL;
  ras.depthClampEnable = 0;
  info.pViewportState = (VkPipelineViewportStateCreateInfo *)local_438;
  sVar3 = std::
          vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          ::size((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                  *)&spec_info.pData);
  info.pNext._4_4_ = (undefined4)sVar3;
  info._16_8_ = std::
                vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                ::data((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                        *)&spec_info.pData);
  info.pDynamicState = (VkPipelineDynamicStateCreateInfo *)layout;
  info.layout = (VkPipelineLayout)render_pass;
  bVar2 = Fossilize::StateRecorder::record_graphics_pipeline
                    (recorder,(VkPipeline)&DAT_00000001,(VkGraphicsPipelineCreateInfo *)&sci.extent,
                     (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                     (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
  if (bVar2) {
    if (((specs->iteration).count != 0) &&
       (uVar1 = (specs->iteration).index,
       sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&specs->data),
       uVar1 < sVar3)) {
      for (local_43c = 0; local_43c < (specs->iteration).count; local_43c = local_43c + 1) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&specs->data,(ulong)(specs->iteration).index);
        *pvVar4 = local_43c;
        bVar2 = Fossilize::StateRecorder::record_graphics_pipeline
                          (recorder,(VkPipeline)(ulong)(local_43c + 2),
                           (VkGraphicsPipelineCreateInfo *)&sci.extent,(VkPipeline *)0x0,0,0,
                           (VkDevice)0x0,(PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
        if (!bVar2) {
          recorder_local = (StateRecorder *)0x0;
          goto LAB_00110937;
        }
      }
    }
    recorder_local = (StateRecorder *)&DAT_00000001;
  }
  else {
    recorder_local = (StateRecorder *)0x0;
  }
LAB_00110937:
  std::vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
  ::~vector((vector<VkVertexInputAttributeDescription,_std::allocator<VkVertexInputAttributeDescription>_>
             *)&vertex_binding.stride);
LAB_00110943:
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  ~vector((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           *)&spec_info.pData);
  return (VkPipeline)recorder_local;
}

Assistant:

static VkPipeline synthesize_graphics_pipeline(StateRecorder &recorder,
                                               const std::vector<uint8_t> *modules,
                                               spvc_compiler *compilers,
                                               VkPipelineLayout layout,
                                               VkRenderPass render_pass,
                                               uint8_t active_rt_mask,
                                               SpecConstant &specs)
{
	std::vector<VkPipelineShaderStageCreateInfo> stages;
	stages.reserve(STAGE_COUNT - 1);

	VkSpecializationInfo spec_info = {};

	spec_info.dataSize = specs.data.size() * sizeof(uint32_t);
	spec_info.pData = specs.data.data();
	spec_info.mapEntryCount = specs.map_entries.size();
	spec_info.pMapEntries = specs.map_entries.data();

	for (unsigned i = 0; i <= STAGE_FRAG; i++)
	{
		if (!modules[i].empty())
		{
			VkShaderModuleCreateInfo module_info = { VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO };
			module_info.codeSize = modules[i].size();
			module_info.pCode = reinterpret_cast<const uint32_t *>(modules[i].data());
			if (!recorder.record_shader_module((VkShaderModule)uint64_t(1 + i), module_info))
				return VK_NULL_HANDLE;

			VkPipelineShaderStageCreateInfo stage = { VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO };
			stage.module = (VkShaderModule)uint64_t(1 + i);
			stage.pName = "main";
			stage.stage = to_vk_shader_stage[i];
			if (spec_info.dataSize != 0)
				stage.pSpecializationInfo = &spec_info;
			stages.push_back(stage);
		}
	}

	VkGraphicsPipelineCreateInfo info = { VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO };
	const VkRect2D sci = {{0, 0}, {1024, 1024}};
	const VkViewport viewport = {0, 0, 1024, 1024, 0, 1};
	VkPipelineViewportStateCreateInfo vp = { VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO };
	{
		vp.scissorCount = 1;
		vp.viewportCount = 1;
		vp.pScissors = &sci;
		vp.pViewports = &viewport;
		info.pViewportState = &vp;
	}

	VkPipelineMultisampleStateCreateInfo ms = { VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO };
	const VkSampleMask sample_mask = 0xffffffffu;
	{
		ms.pSampleMask = &sample_mask;
		ms.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
		info.pMultisampleState = &ms;
	}

	VkPipelineTessellationStateCreateInfo tess = { VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_STATE_CREATE_INFO };
	{
		tess.patchControlPoints = 1;
		info.pTessellationState = &tess;
	}

	VkPipelineDynamicStateCreateInfo dyn = { VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO };
	{
		info.pDynamicState = &dyn;
	}

	VkPipelineColorBlendStateCreateInfo blend = { VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO };
	VkPipelineColorBlendAttachmentState attachments[8] = {};
	{
		for (unsigned i = 0; i < 8; i++)
		{
			if (active_rt_mask & (1u << i))
			{
				blend.attachmentCount = i + 1;
				attachments[i].colorWriteMask = 0xf;
			}
		}
		blend.pAttachments = attachments;
		info.pColorBlendState = &blend;
	}

	std::vector<VkVertexInputAttributeDescription> attributes;
	VkVertexInputBindingDescription vertex_binding = {};

	VkPipelineVertexInputStateCreateInfo vi = { VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO };
	if (compilers[STAGE_VERT])
	{
		if (!append_attributes(compilers[STAGE_VERT], attributes, vertex_binding.stride))
			return VK_NULL_HANDLE;

		vi.vertexBindingDescriptionCount = 1;
		vi.pVertexBindingDescriptions = &vertex_binding;
		vi.vertexAttributeDescriptionCount = uint32_t(attributes.size());
		vi.pVertexAttributeDescriptions = attributes.data();
		info.pVertexInputState = &vi;
	}

	VkPipelineInputAssemblyStateCreateInfo ia = { VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO };
	if (compilers[STAGE_VERT])
	{
		ia.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
		info.pInputAssemblyState = &ia;
	}

	VkPipelineRasterizationStateCreateInfo ras = { VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO };
	{
		ras.cullMode = VK_CULL_MODE_NONE;
		ras.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
		ras.polygonMode = VK_POLYGON_MODE_FILL;
		info.pRasterizationState = &ras;
	}

	info.stageCount = uint32_t(stages.size());
	info.pStages = stages.data();
	info.layout = layout;
	info.renderPass = render_pass;

	if (!recorder.record_graphics_pipeline((VkPipeline)uint64_t(1), info, nullptr, 0))
		return VK_NULL_HANDLE;

	if (specs.iteration.count && specs.iteration.index < specs.data.size())
	{
		for (uint32_t i = 0; i < specs.iteration.count; i++)
		{
			specs.data[specs.iteration.index] = i;
			if (!recorder.record_graphics_pipeline((VkPipeline) uint64_t(2 + i), info, nullptr, 0))
				return VK_NULL_HANDLE;
		}
	}

	return (VkPipeline)uint64_t(1);
}